

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxForLoop::Emit(FxForLoop *this,VMFunctionBuilder *build)

{
  uint uVar1;
  undefined4 extraout_var;
  size_t sVar2;
  size_t loopstart_00;
  undefined4 extraout_var_00;
  size_t loc;
  bool bVar3;
  ExpEmit local_74;
  ExpEmit iter;
  ExpEmit init;
  undefined1 local_58 [8];
  TArray<unsigned_long,_unsigned_long> no;
  TArray<unsigned_long,_unsigned_long> yes;
  size_t codestart;
  size_t loopend;
  size_t loopstart;
  VMFunctionBuilder *build_local;
  FxForLoop *this_local;
  
  if ((this->Condition != (FxExpression *)0x0) && (this->Condition->ValueType == (PType *)TypeBool))
  {
    uVar1 = (*this->Condition->_vptr_FxExpression[3])();
    bVar3 = true;
    if ((uVar1 & 1) == 0) goto LAB_0077c655;
  }
  bVar3 = this->Condition == (FxExpression *)0x0;
LAB_0077c655:
  if (bVar3) {
    TArray<unsigned_long,_unsigned_long>::TArray((TArray<unsigned_long,_unsigned_long> *)&no.Most);
    TArray<unsigned_long,_unsigned_long>::TArray((TArray<unsigned_long,_unsigned_long> *)local_58);
    if (this->Init != (FxExpression *)0x0) {
      iter._0_4_ = (*this->Init->_vptr_FxExpression[9])(this->Init,build);
      iter.Konst = (bool)(char)extraout_var;
      iter.Fixed = (bool)(char)((uint)extraout_var >> 8);
      iter.Final = (bool)(char)((uint)extraout_var >> 0x10);
      iter.Target = (bool)(char)((uint)extraout_var >> 0x18);
      ExpEmit::Free(&iter,build);
    }
    sVar2 = VMFunctionBuilder::GetAddress(build);
    if (this->Condition != (FxExpression *)0x0) {
      (*this->Condition->_vptr_FxExpression[10])(this->Condition,build,0,&no.Most,local_58);
    }
    VMFunctionBuilder::BackpatchListToHere(build,(TArray<unsigned_long,_unsigned_long> *)&no.Most);
    if (this->Code != (FxExpression *)0x0) {
      FxExpression::EmitStatement(this->Code,build);
    }
    loopstart_00 = VMFunctionBuilder::GetAddress(build);
    if (this->Iteration != (FxExpression *)0x0) {
      local_74._0_4_ = (*this->Iteration->_vptr_FxExpression[9])(this->Iteration,build);
      local_74.Konst = (bool)(char)extraout_var_00;
      local_74.Fixed = (bool)(char)((uint)extraout_var_00 >> 8);
      local_74.Final = (bool)(char)((uint)extraout_var_00 >> 0x10);
      local_74.Target = (bool)(char)((uint)extraout_var_00 >> 0x18);
      ExpEmit::Free(&local_74,build);
    }
    loc = VMFunctionBuilder::Emit(build,0x44,0);
    VMFunctionBuilder::Backpatch(build,loc,sVar2);
    sVar2 = VMFunctionBuilder::GetAddress(build);
    VMFunctionBuilder::BackpatchListToHere(build,(TArray<unsigned_long,_unsigned_long> *)local_58);
    FxLoopStatement::Backpatch(&this->super_FxLoopStatement,build,loopstart_00,sVar2);
    ExpEmit::ExpEmit((ExpEmit *)&this_local);
    TArray<unsigned_long,_unsigned_long>::~TArray((TArray<unsigned_long,_unsigned_long> *)local_58);
    TArray<unsigned_long,_unsigned_long>::~TArray((TArray<unsigned_long,_unsigned_long> *)&no.Most);
    return (ExpEmit)this_local;
  }
  __assert_fail("(Condition && Condition->ValueType == TypeBool && !Condition->isConstant()) || Condition == nullptr"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0x242e,"virtual ExpEmit FxForLoop::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxForLoop::Emit(VMFunctionBuilder *build)
{
	assert((Condition && Condition->ValueType == TypeBool && !Condition->isConstant()) || Condition == nullptr);

	size_t loopstart, loopend;
	size_t codestart;
	TArray<size_t> yes, no;

	// Init statement (only used by DECORATE. ZScript is pulling it before the loop statement and enclosing the entire loop in a compound statement so that Init can have local variables.)
	if (Init != nullptr)
	{
		ExpEmit init = Init->Emit(build);
		init.Free(build);
	}

	// Evaluate the condition and execute/break out of the loop.
	codestart = build->GetAddress();
	if (Condition != nullptr)
	{
		Condition->EmitCompare(build, false, yes, no);
	}

	build->BackpatchListToHere(yes);
	// Execute the loop's content.
	if (Code != nullptr)
	{
		Code->EmitStatement(build);
	}

	// Iteration statement.
	loopstart = build->GetAddress();
	if (Iteration != nullptr)
	{
		ExpEmit iter = Iteration->Emit(build);
		iter.Free(build);
	}
	build->Backpatch(build->Emit(OP_JMP, 0), codestart);

	// End of loop.
	loopend = build->GetAddress();
	build->BackpatchListToHere(no);

	Backpatch(build, loopstart, loopend);
	return ExpEmit();
}